

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O1

int test_relprod(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  MTBDD vars_00;
  MTBDD vars_01;
  BDD BVar3;
  BDD BVar4;
  BDD BVar5;
  BDDVAR vars [3];
  BDDVAR all_vars [6];
  uint8_t local_e9 [9];
  undefined1 local_e0 [40];
  char local_b8 [24];
  ulong local_a0;
  BDD local_98;
  BDD local_90;
  BDD local_88;
  uint8_t local_80 [8];
  uint8_t local_78 [8];
  undefined4 local_70;
  undefined2 local_6c;
  undefined4 local_6a;
  undefined2 local_66;
  undefined4 local_64;
  undefined2 local_60;
  undefined4 local_5e;
  undefined2 local_5a;
  uint32_t local_58 [4];
  uint32_t local_48 [6];
  
  local_58[0] = 0;
  local_58[1] = 2;
  local_58[2] = 4;
  local_48[0] = 0;
  local_48[1] = 1;
  local_48[2] = 2;
  local_48[3] = 3;
  local_48[4] = 4;
  local_48[5] = 5;
  vars_00 = mtbdd_set_from_array(local_58,3);
  vars_01 = mtbdd_set_from_array(local_48,6);
  local_e0._32_8_ = &local_5e;
  local_5e = 0x1000100;
  local_5a = 0x100;
  local_e0._0_8_ = sylvan_union_cube_WRAP;
  local_e0._8_8_ = (_Worker *)0x1;
  local_e0._16_8_ = 0;
  local_e0._24_8_ = vars_01;
  lace_run_task((Task *)local_e0);
  local_e0._32_8_ = &local_64;
  local_64 = 0x20001;
  local_60 = 2;
  local_e0._0_8_ = sylvan_union_cube_WRAP;
  local_e0._8_8_ = (_Worker *)0x1;
  local_e0._24_8_ = vars_01;
  lace_run_task((Task *)local_e0);
  local_e0._32_8_ = &local_6a;
  local_6a = 0x10002;
  local_66 = 2;
  local_e0._0_8_ = sylvan_union_cube_WRAP;
  local_e0._8_8_ = (_Worker *)0x1;
  local_e0._24_8_ = vars_01;
  lace_run_task((Task *)local_e0);
  local_e0._32_8_ = &local_70;
  local_70 = 0x20002;
  local_6c = 1;
  local_e0._0_8_ = sylvan_union_cube_WRAP;
  local_e0._8_8_ = (_Worker *)0x1;
  local_e0._24_8_ = vars_01;
  lace_run_task((Task *)local_e0);
  uVar1 = local_e0._16_8_;
  local_e9[6] = '\0';
  local_e9[7] = '\0';
  local_e9[8] = 1;
  BVar3 = sylvan_cube(vars_00,local_e9 + 6);
  local_e9[3] = '\0';
  local_e9[4] = '\0';
  local_e9[5] = 0;
  BVar4 = sylvan_cube(vars_00,local_e9 + 3);
  local_e9[0] = '\x01';
  local_e9[1] = '\x01';
  local_e9[2] = 1;
  local_88 = sylvan_cube(vars_00,local_e9);
  local_e0._0_8_ = sylvan_relnext_WRAP;
  local_e0._8_8_ = (_Worker *)0x1;
  local_e0._24_8_ = uVar1;
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_e0._16_8_ = BVar3;
  local_e0._32_8_ = vars_01;
  local_90 = BVar3;
  lace_run_task((Task *)local_e0);
  uVar2 = local_e0._16_8_;
  local_e0._0_8_ = sylvan_relprev_WRAP;
  local_e0._8_8_ = (_Worker *)0x1;
  local_e0._24_8_ = local_e0._16_8_;
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_e0._16_8_ = uVar1;
  local_e0._32_8_ = vars_01;
  lace_run_task((Task *)local_e0);
  if (uVar2 == BVar4) {
    local_a0 = BVar4 ^ 0x8000000000000000;
    if (local_e0._16_8_ == local_a0) {
      local_e0._0_8_ = sylvan_relnext_WRAP;
      local_e0._8_8_ = (_Worker *)0x1;
      local_e0._24_8_ = uVar1;
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_e0._16_8_ = uVar2;
      local_e0._32_8_ = vars_01;
      local_98 = BVar4;
      lace_run_task((Task *)local_e0);
      uVar2 = local_e0._16_8_;
      local_e0._0_8_ = sylvan_relprev_WRAP;
      local_e0._8_8_ = (_Worker *)0x1;
      local_e0._24_8_ = local_e0._16_8_;
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_e0._16_8_ = uVar1;
      local_e0._32_8_ = vars_01;
      lace_run_task((Task *)local_e0);
      BVar3 = local_98;
      if (uVar2 == local_88) {
        if (local_e0._16_8_ == local_98) {
          local_78[0] = '\0';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          local_78[4] = '\0';
          local_78[5] = '\x01';
          BVar5 = sylvan_cube(vars_01,local_78);
          BVar4 = local_90;
          local_e0._0_8_ = sylvan_relprev_WRAP;
          local_e0._8_8_ = (_Worker *)0x1;
          local_e0._24_8_ = local_90;
          local_b8[0] = '\0';
          local_b8[1] = '\0';
          local_b8[2] = '\0';
          local_b8[3] = '\0';
          local_e0._16_8_ = BVar5;
          local_e0._32_8_ = vars_01;
          lace_run_task((Task *)local_e0);
          if (local_e0._16_8_ == BVar3) {
            local_e0._24_8_ = BVar4 ^ 0x8000000000000000;
            local_e0._0_8_ = sylvan_relprev_WRAP;
            local_e0._8_8_ = (_Worker *)0x1;
            local_b8[0] = '\0';
            local_b8[1] = '\0';
            local_b8[2] = '\0';
            local_b8[3] = '\0';
            local_e0._16_8_ = BVar5;
            local_e0._32_8_ = vars_01;
            lace_run_task((Task *)local_e0);
            if (local_e0._16_8_ == 0) {
              local_e0._0_8_ = sylvan_relnext_WRAP;
              local_e0._8_8_ = (_Worker *)0x1;
              local_e0._16_8_ = BVar4;
              local_b8[0] = '\0';
              local_b8[1] = '\0';
              local_b8[2] = '\0';
              local_b8[3] = '\0';
              local_e0._24_8_ = BVar5;
              local_e0._32_8_ = vars_01;
              lace_run_task((Task *)local_e0);
              if (local_e0._16_8_ == 0) {
                local_e0._0_8_ = sylvan_relnext_WRAP;
                local_e0._8_8_ = (_Worker *)0x1;
                local_e0._16_8_ = BVar3;
                local_b8[0] = '\0';
                local_b8[1] = '\0';
                local_b8[2] = '\0';
                local_b8[3] = '\0';
                local_e0._24_8_ = BVar5;
                local_e0._32_8_ = vars_01;
                lace_run_task((Task *)local_e0);
                if (local_e0._16_8_ == BVar4) {
                  local_80[0] = '\0';
                  local_80[1] = '\0';
                  local_80[2] = '\0';
                  local_80[3] = '\0';
                  local_80[4] = '\0';
                  local_80[5] = '\x02';
                  BVar5 = sylvan_cube(vars_01,local_80);
                  local_e0._0_8_ = sylvan_relprev_WRAP;
                  local_e0._8_8_ = (_Worker *)0x1;
                  local_e0._24_8_ = BVar4;
                  local_b8[0] = '\0';
                  local_b8[1] = '\0';
                  local_b8[2] = '\0';
                  local_b8[3] = '\0';
                  local_e0._16_8_ = BVar5;
                  local_e0._32_8_ = vars_01;
                  lace_run_task((Task *)local_e0);
                  if (local_e0._16_8_ == BVar3) {
                    local_e0._0_8_ = sylvan_relprev_WRAP;
                    local_e0._8_8_ = (_Worker *)0x1;
                    local_e0._24_8_ = BVar3;
                    local_b8[0] = '\0';
                    local_b8[1] = '\0';
                    local_b8[2] = '\0';
                    local_b8[3] = '\0';
                    local_e0._16_8_ = BVar5;
                    local_e0._32_8_ = vars_01;
                    lace_run_task((Task *)local_e0);
                    if (local_e0._16_8_ == BVar3) {
                      local_e0._0_8_ = sylvan_relnext_WRAP;
                      local_e0._8_8_ = (_Worker *)0x1;
                      local_e0._16_8_ = local_a0;
                      local_b8[0] = '\0';
                      local_b8[1] = '\0';
                      local_b8[2] = '\0';
                      local_b8[3] = '\0';
                      local_e0._24_8_ = BVar5;
                      local_e0._32_8_ = vars_01;
                      lace_run_task((Task *)local_e0);
                      if (local_e0._16_8_ == 0) {
                        return 0;
                      }
                      test_relprod_cold_11();
                    }
                    else {
                      test_relprod_cold_10();
                    }
                  }
                  else {
                    test_relprod_cold_9();
                  }
                }
                else {
                  test_relprod_cold_8();
                }
              }
              else {
                test_relprod_cold_7();
              }
            }
            else {
              test_relprod_cold_6();
            }
          }
          else {
            test_relprod_cold_5();
          }
        }
        else {
          test_relprod_cold_4();
        }
      }
      else {
        test_relprod_cold_3();
      }
    }
    else {
      test_relprod_cold_2();
    }
  }
  else {
    test_relprod_cold_1();
  }
  return 1;
}

Assistant:

int
test_relprod()
{
    BDDVAR vars[] = {0,2,4};
    BDDVAR all_vars[] = {0,1,2,3,4,5};

    BDDSET vars_set = sylvan_set_fromarray(vars, 3);
    BDDSET all_vars_set = sylvan_set_fromarray(all_vars, 6);

    BDD s, t, next, prev;
    BDD zeroes, ones;

    // transition relation: 000 --> 111 and !000 --> 000
    t = sylvan_false;
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){0,1,0,1,0,1}));
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){1,0,2,0,2,0}));
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){2,0,1,0,2,0}));
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){2,0,2,0,1,0}));

    s = sylvan_cube(vars_set, (uint8_t[]){0,0,1});
    zeroes = sylvan_cube(vars_set, (uint8_t[]){0,0,0});
    ones = sylvan_cube(vars_set, (uint8_t[]){1,1,1});

    next = sylvan_relnext(s, t, all_vars_set);
    prev = sylvan_relprev(t, next, all_vars_set);
    test_assert(next == zeroes);
    test_assert(prev == sylvan_not(zeroes));

    next = sylvan_relnext(next, t, all_vars_set);
    prev = sylvan_relprev(t, next, all_vars_set);
    test_assert(next == ones);
    test_assert(prev == zeroes);

    t = sylvan_cube(all_vars_set, (uint8_t[]){0,0,0,0,0,1});
    test_assert(sylvan_relprev(t, s, all_vars_set) == zeroes);
    test_assert(sylvan_relprev(t, sylvan_not(s), all_vars_set) == sylvan_false);
    test_assert(sylvan_relnext(s, t, all_vars_set) == sylvan_false);
    test_assert(sylvan_relnext(zeroes, t, all_vars_set) == s);

    t = sylvan_cube(all_vars_set, (uint8_t[]){0,0,0,0,0,2});
    test_assert(sylvan_relprev(t, s, all_vars_set) == zeroes);
    test_assert(sylvan_relprev(t, zeroes, all_vars_set) == zeroes);
    test_assert(sylvan_relnext(sylvan_not(zeroes), t, all_vars_set) == sylvan_false);

    return 0;
}